

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall
CLI::App::_parse_config(App *this,vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *args)

{
  pointer pCVar1;
  bool bVar2;
  ConfigError *__return_storage_ptr__;
  pointer pCVar3;
  string sStack_98;
  ConfigItem item;
  
  pCVar3 = (args->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (args->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (pCVar3 == pCVar1) {
      return;
    }
    ConfigItem::ConfigItem(&item,pCVar3);
    bVar2 = _parse_single_config(this,&item,0);
    if (!bVar2 && this->allow_config_extras_ == error) break;
    ConfigItem::~ConfigItem(&item);
    pCVar3 = pCVar3 + 1;
  }
  __return_storage_ptr__ = (ConfigError *)__cxa_allocate_exception(0x38);
  ConfigItem::fullname_abi_cxx11_(&sStack_98,&item);
  ConfigError::Extras(__return_storage_ptr__,&sStack_98);
  __cxa_throw(__return_storage_ptr__,&ConfigError::typeinfo,Error::~Error);
}

Assistant:

void _parse_config(std::vector<ConfigItem> &args) {
        for(ConfigItem item : args) {
            if(!_parse_single_config(item) && allow_config_extras_ == config_extras_mode::error)
                throw ConfigError::Extras(item.fullname());
        }
    }